

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O0

void Bac_ManWriteBlifNtk(FILE *pFile,Bac_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Bac_Ntk_t *p_local;
  FILE *pFile_local;
  
  iVar1 = Vec_IntSize(&p->vFanin);
  iVar2 = Bac_NtkObjNum(p);
  if (iVar1 == iVar2) {
    pcVar3 = Bac_NtkName(p);
    fprintf((FILE *)pFile,".model %s\n",pcVar3);
    fprintf((FILE *)pFile,".inputs");
    Bac_ManWriteBlifArray(pFile,p,&p->vInputs,-1);
    fprintf((FILE *)pFile,".outputs");
    Bac_ManWriteBlifArray(pFile,p,&p->vOutputs,-1);
    Bac_ManWriteBlifLines(pFile,p);
    fprintf((FILE *)pFile,".end\n\n");
    return;
  }
  __assert_fail("Vec_IntSize(&p->vFanin) == Bac_NtkObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteBlif.c"
                ,0xc2,"void Bac_ManWriteBlifNtk(FILE *, Bac_Ntk_t *)");
}

Assistant:

void Bac_ManWriteBlifNtk( FILE * pFile, Bac_Ntk_t * p )
{
    assert( Vec_IntSize(&p->vFanin) == Bac_NtkObjNum(p) );
    // write header
    fprintf( pFile, ".model %s\n", Bac_NtkName(p) );
    fprintf( pFile, ".inputs" );
    Bac_ManWriteBlifArray( pFile, p, &p->vInputs, -1 );
    fprintf( pFile, ".outputs" );
    Bac_ManWriteBlifArray( pFile, p, &p->vOutputs, -1 );
    // write objects
    Bac_ManWriteBlifLines( pFile, p );
    fprintf( pFile, ".end\n\n" );
}